

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * chaiscript::exception::eval_error::format
                   (string *__return_storage_ptr__,string *t_why,File_Position *t_where,
                   string *t_fname)

{
  File_Position *t_where_00;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  format_why(&sStack_1c8,t_why);
  std::operator<<(local_198,(string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::operator<<(local_198," ");
  format_filename(&sStack_1c8,t_fname);
  std::operator<<(local_198,(string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::operator<<(local_198," ");
  format_location_abi_cxx11_(&sStack_1c8,(eval_error *)t_where,t_where_00);
  std::operator<<(local_198,(string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string format(const std::string &t_why, const File_Position &t_where, const std::string &t_fname) {
        std::stringstream ss;

        ss << format_why(t_why);
        ss << " ";

        ss << format_filename(t_fname);
        ss << " ";

        ss << format_location(t_where);

        return ss.str();
      }